

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O3

void av1_fp_encode_tiles_row_mt(AV1_COMP *cpi)

{
  ThreadData_conflict *mb;
  uint uVar1;
  TileDataEnc *pTVar2;
  EncWorkerData *pEVar3;
  AVxWorker *pAVar4;
  macroblock *mb_00;
  EncWorkerData *pEVar5;
  AVxWorkerInterface *pAVar6;
  AVxWorker *pAVar7;
  byte bVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  bool bVar23;
  aom_internal_error_info error_info;
  aom_internal_error_info local_1d0;
  
  uVar1 = (cpi->common).tiles.cols;
  iVar12 = (cpi->common).tiles.rows;
  lVar20 = (long)iVar12;
  if (lVar20 < 1) {
    uVar13 = 0;
  }
  else {
    iVar10 = (cpi->common).mi_params.mi_rows;
    iVar16 = (cpi->common).tiles.row_start_sb[0];
    lVar15 = 0;
    uVar13 = 0;
    do {
      bVar8 = (byte)((cpi->common).seq_params)->mib_size_log2;
      iVar17 = iVar16 << (bVar8 & 0x1f);
      iVar16 = (cpi->common).tiles.row_start_sb[lVar15 + 1];
      iVar18 = iVar16 << (bVar8 & 0x1f);
      lVar15 = lVar15 + 1;
      if (iVar10 <= iVar18) {
        iVar18 = iVar10;
      }
      uVar11 = (~(-1 << (""[cpi->fp_block_size] & 0x1f)) - iVar17) + iVar18 >>
               (""[cpi->fp_block_size] & 0x1f);
      if ((int)uVar13 <= (int)uVar11) {
        uVar13 = uVar11;
      }
    } while (lVar20 != lVar15);
  }
  bVar23 = true;
  if (((cpi->mt_info).enc_row_mt.allocated_tile_cols == uVar1) &&
     ((cpi->mt_info).enc_row_mt.allocated_tile_rows == iVar12)) {
    bVar23 = (cpi->mt_info).enc_row_mt.allocated_rows != uVar13;
  }
  if (cpi->allocated_tiles < (int)(iVar12 * uVar1)) {
    av1_alloc_tile_data(cpi);
  }
  if (bVar23) {
    row_mt_mem_alloc(cpi,uVar13,-1,0);
  }
  av1_init_tile_data(cpi);
  uVar11 = (cpi->mt_info).num_mod_workers[0];
  if (uVar11 == 0) {
    uVar11 = av1_fp_compute_num_enc_workers(cpi);
  }
  memset((cpi->mt_info).enc_row_mt.thread_id_to_tile_id,0xff,0x100);
  (cpi->mt_info).enc_row_mt.firstpass_mt_exit = false;
  if (0 < iVar12) {
    lVar21 = 0x5d00;
    lVar15 = 0;
    do {
      uVar14 = (ulong)uVar1;
      lVar22 = lVar21;
      if (0 < (int)uVar1) {
        do {
          pTVar2 = cpi->tile_data;
          memset(*(void **)((long)((pTVar2->tctx).txb_skip_cdf + -1) + 0x16 + lVar22),0xff,
                 (ulong)uVar13 << 2);
          *(undefined4 *)((long)((pTVar2->tctx).txb_skip_cdf + -1) + 0x2a + lVar22) =
               *(undefined4 *)((long)pTVar2 + lVar22 + -0x5d00);
          *(undefined4 *)((long)((pTVar2->tctx).txb_skip_cdf + -1) + 0x2e + lVar22) = 0;
          *(undefined4 *)((long)((pTVar2->tctx).txb_skip_cdf + -1) + 0x22 + lVar22) = 0;
          lVar22 = lVar22 + 0x5d10;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      lVar15 = lVar15 + 1;
      lVar21 = lVar21 + (ulong)uVar1 * 0x5d10;
    } while (lVar15 != lVar20);
  }
  uVar13 = (cpi->mt_info).num_workers;
  if ((int)uVar11 < (int)uVar13) {
    uVar13 = uVar11;
  }
  uVar14 = (ulong)uVar13;
  if ((int)uVar13 < 1) {
    aom_get_worker_interface();
  }
  else {
    uVar9 = 0;
    iVar10 = 0;
    do {
      (cpi->mt_info).enc_row_mt.thread_id_to_tile_id[uVar9] = iVar10;
      iVar10 = iVar10 + 1;
      if (iVar10 == iVar12 * uVar1) {
        iVar10 = 0;
      }
      uVar9 = uVar9 + 1;
    } while (uVar14 != uVar9);
    mb = &cpi->td;
    lVar20 = uVar14 - 1;
    pAVar7 = (cpi->mt_info).workers;
    pEVar3 = (cpi->mt_info).tile_thr_data;
    pEVar5 = pEVar3 + lVar20;
    pAVar7[lVar20].hook = fp_enc_row_mt_worker_hook;
    pAVar7[lVar20].data1 = pEVar5;
    pAVar7[lVar20].data2 = (void *)0x0;
    pEVar3[lVar20].thread_id = (int)lVar20;
    pEVar3[lVar20].start = (int)lVar20;
    pEVar3[lVar20].cpi = cpi;
    if (lVar20 != 0) {
      iVar12 = uVar13 - 2;
      lVar21 = uVar14 * -0x1d0 + 0x1d0;
      lVar19 = uVar14 * 0x1d0 + -0x3a0;
      lVar22 = uVar14 * 0x38 + -0x48;
      lVar15 = lVar20;
      do {
        pEVar5->td = pEVar5->original_td;
        memcpy(pEVar5->original_td,mb,0x256b0);
        av1_alloc_src_diff_buf(&cpi->common,&pEVar5->td->mb);
        lVar15 = lVar15 + -1;
        pAVar7 = (cpi->mt_info).workers;
        pEVar3 = (cpi->mt_info).tile_thr_data;
        pEVar5 = pEVar3 + lVar15;
        *(code **)((long)pAVar7 + lVar22 + -0x10) = fp_enc_row_mt_worker_hook;
        *(char **)((long)pAVar7 + lVar22 + -8) = (pEVar3->error_info).detail + lVar19 + -0x20;
        *(undefined8 *)((long)&pAVar7->impl_ + lVar22) = 0;
        *(int *)((long)&pEVar3->thread_id + lVar19) = iVar12;
        *(int *)((long)&pEVar3->start + lVar19) = iVar12;
        *(AV1_COMP **)((pEVar3->error_info).detail + lVar19 + -0x20) = cpi;
        iVar12 = iVar12 + -1;
        lVar21 = lVar21 + 0x1d0;
        lVar19 = lVar19 + -0x1d0;
        lVar22 = lVar22 + -0x38;
      } while (lVar15 != 0);
      pEVar5 = (EncWorkerData *)((long)pEVar3 - lVar21);
    }
    pEVar5->td = mb;
    av1_alloc_src_diff_buf(&cpi->common,&mb->mb);
    pAVar6 = aom_get_worker_interface();
    pAVar4 = (cpi->mt_info).workers;
    pAVar7 = pAVar4 + lVar20;
    pAVar4[lVar20].had_error = 0;
    if (lVar20 != 0) {
      lVar21 = uVar14 * -0x38 + 0x38;
      lVar15 = uVar14 * 0x38 + -0x40;
      do {
        (*pAVar6->launch)(pAVar7);
        lVar20 = lVar20 + -1;
        pAVar4 = (cpi->mt_info).workers;
        pAVar7 = pAVar4 + lVar20;
        *(undefined4 *)((long)&pAVar4->impl_ + lVar15) = 0;
        lVar21 = lVar21 + 0x38;
        lVar15 = lVar15 + -0x38;
      } while (lVar20 != 0);
      pAVar7 = (AVxWorker *)((long)pAVar4 - lVar21);
    }
    (*pAVar6->execute)(pAVar7);
  }
  pAVar6 = aom_get_worker_interface();
  pAVar7 = (cpi->mt_info).workers;
  iVar12 = pAVar7->had_error;
  if (iVar12 != 0) {
    memcpy(&local_1d0,(void *)((long)pAVar7->data1 + 0x18),0x1a0);
  }
  if (1 < (int)uVar13) {
    uVar9 = uVar14 + 1;
    lVar20 = uVar14 * 0x38;
    do {
      pAVar4 = (cpi->mt_info).workers;
      iVar10 = (*pAVar6->sync)((AVxWorker *)((long)&pAVar4[-1].impl_ + lVar20));
      if (iVar10 == 0) {
        memcpy(&local_1d0,(void *)(*(long *)((long)&pAVar4[-1].data1 + lVar20) + 0x18),0x1a0);
        iVar12 = 1;
      }
      uVar9 = uVar9 - 1;
      lVar20 = lVar20 + -0x38;
    } while (2 < uVar9);
  }
  if (iVar12 != 0) {
    aom_internal_error_copy((cpi->common).error,&local_1d0);
  }
  *(aom_internal_error_info **)(*(long *)((long)pAVar7->data1 + 8) + 0x2b90) = (cpi->common).error;
  if (0 < (int)uVar13) {
    uVar9 = uVar14 + 1;
    lVar20 = uVar14 * 0x1d0 + -0x1c8;
    do {
      mb_00 = *(macroblock **)((((cpi->mt_info).tile_thr_data)->error_info).detail + lVar20 + -0x20)
      ;
      if ((ThreadData_conflict *)mb_00 != &cpi->td) {
        av1_dealloc_src_diff_buf
                  (mb_00,(uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1);
      }
      uVar9 = uVar9 - 1;
      lVar20 = lVar20 + -0x1d0;
    } while (1 < uVar9);
  }
  return;
}

Assistant:

void av1_fp_encode_tiles_row_mt(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &mt_info->enc_row_mt;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  int *thread_id_to_tile_id = enc_row_mt->thread_id_to_tile_id;
  int num_workers = 0;
  int max_mb_rows = 0;

  max_mb_rows = fp_compute_max_mb_rows(cm, cpi->fp_block_size);
  const bool alloc_row_mt_mem = enc_row_mt->allocated_tile_cols != tile_cols ||
                                enc_row_mt->allocated_tile_rows != tile_rows ||
                                enc_row_mt->allocated_rows != max_mb_rows;
  const bool alloc_tile_data = cpi->allocated_tiles < tile_cols * tile_rows;

  assert(IMPLIES(cpi->tile_data == NULL, alloc_tile_data));
  if (alloc_tile_data) {
    av1_alloc_tile_data(cpi);
  }

  assert(IMPLIES(alloc_tile_data, alloc_row_mt_mem));
  if (alloc_row_mt_mem) {
    row_mt_mem_alloc(cpi, max_mb_rows, -1, 0);
  }

  av1_init_tile_data(cpi);

  // For pass = 1, compute the no. of workers needed. For single-pass encode
  // (pass = 0), no. of workers are already computed.
  if (mt_info->num_mod_workers[MOD_FP] == 0)
    num_workers = av1_fp_compute_num_enc_workers(cpi);
  else
    num_workers = mt_info->num_mod_workers[MOD_FP];

  memset(thread_id_to_tile_id, -1,
         sizeof(*thread_id_to_tile_id) * MAX_NUM_THREADS);
  enc_row_mt->firstpass_mt_exit = false;

  for (int tile_row = 0; tile_row < tile_rows; tile_row++) {
    for (int tile_col = 0; tile_col < tile_cols; tile_col++) {
      int tile_index = tile_row * tile_cols + tile_col;
      TileDataEnc *const this_tile = &cpi->tile_data[tile_index];
      AV1EncRowMultiThreadSync *const row_mt_sync = &this_tile->row_mt_sync;

      // Initialize num_finished_cols to -1 for all rows.
      memset(row_mt_sync->num_finished_cols, -1,
             sizeof(*row_mt_sync->num_finished_cols) * max_mb_rows);
      row_mt_sync->next_mi_row = this_tile->tile_info.mi_row_start;
      row_mt_sync->num_threads_working = 0;

      // intraBC mode is not evaluated during first-pass encoding. Hence, no
      // additional top-right delay is required.
      row_mt_sync->intrabc_extra_top_right_sb_delay = 0;
    }
  }

  num_workers = AOMMIN(num_workers, mt_info->num_workers);
  assign_tile_to_thread(thread_id_to_tile_id, tile_cols * tile_rows,
                        num_workers);
  fp_prepare_enc_workers(cpi, fp_enc_row_mt_worker_hook, num_workers);
  launch_workers(&cpi->mt_info, num_workers);
  sync_enc_workers(&cpi->mt_info, cm, num_workers);
  dealloc_thread_data_src_diff_buf(cpi, num_workers);
}